

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O2

void av1_highbd_filter_intra_edge_sse4_1(uint16_t *p,int sz,int strength)

{
  undefined1 auVar1 [32];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  uint uVar4;
  uint uVar5;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar16 [16];
  short sVar23;
  undefined1 auVar17 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar6;
  short sVar9;
  
  if (strength != 0) {
    p[-1] = *p;
    uVar4 = sz - 1;
    auVar7 = pshuflw(ZEXT216(p[(long)sz + -1]),ZEXT216(p[(long)sz + -1]),0);
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = auVar7._0_4_;
    auVar7._12_4_ = auVar7._0_4_;
    *(undefined1 (*) [16])(p + sz) = auVar7;
    pauVar2 = (undefined1 (*) [16])(p + -1);
    if (strength != 3) {
      pauVar2 = (undefined1 (*) [16])p;
    }
    pauVar3 = (undefined1 (*) [16])(p + 1);
    auVar10 = lddqu(in_XMM1,(undefined1  [16])av1_highbd_filter_intra_edge_sse4_1::v_const[0]);
    if (strength < 3) {
      auVar11 = lddqu(in_XMM2,(undefined1  [16])
                              av1_highbd_filter_intra_edge_sse4_1::kern[(int)(strength - 1U)]);
      auVar7 = lddqu(auVar7,*(undefined1 (*) [16])p);
      auVar13 = lddqu(in_XMM5,*(undefined1 (*) [16])(p + 8));
      pauVar2 = pauVar2 + 2;
      auVar12 = pmovsxbw(in_XMM3,0x808080808080808);
      for (; 0 < (int)uVar4; uVar4 = uVar4 - uVar5) {
        uVar5 = 8;
        if (uVar4 < 8) {
          uVar5 = uVar4;
        }
        auVar1._16_16_ = auVar13;
        auVar1._0_16_ = auVar7;
        sVar6 = auVar7._4_2_;
        sVar9 = auVar7._6_2_;
        sVar18 = auVar7._8_2_;
        sVar19 = auVar7._10_2_;
        sVar20 = auVar7._12_2_;
        sVar21 = auVar7._14_2_;
        auVar24._0_2_ = (sVar6 + auVar7._0_2_) * auVar11._0_2_;
        auVar24._2_2_ = auVar7._2_2_ * auVar11._2_2_;
        auVar24._4_2_ = (sVar9 + auVar7._2_2_) * auVar11._4_2_;
        auVar24._6_2_ = sVar6 * auVar11._6_2_;
        auVar24._8_2_ = (sVar18 + sVar6) * auVar11._8_2_;
        auVar24._10_2_ = sVar9 * auVar11._10_2_;
        auVar24._12_2_ = (sVar19 + sVar9) * auVar11._12_2_;
        auVar24._14_2_ = sVar18 * auVar11._14_2_;
        auVar16._0_2_ = (sVar20 + sVar18) * auVar11._0_2_;
        auVar16._2_2_ = sVar19 * auVar11._2_2_;
        auVar16._4_2_ = (sVar21 + sVar19) * auVar11._4_2_;
        auVar16._6_2_ = sVar20 * auVar11._6_2_;
        auVar16._8_2_ = (auVar13._0_2_ + sVar20) * auVar11._8_2_;
        auVar16._10_2_ = sVar21 * auVar11._10_2_;
        auVar16._12_2_ = (auVar13._2_2_ + sVar21) * auVar11._12_2_;
        auVar16._14_2_ = auVar13._0_2_ * auVar11._14_2_;
        auVar7 = phaddw(auVar24,auVar16);
        auVar25._0_2_ = (ushort)(auVar7._0_2_ + auVar12._0_2_) >> 4;
        auVar25._2_2_ = (ushort)(auVar7._2_2_ + auVar12._2_2_) >> 4;
        auVar25._4_2_ = (ushort)(auVar7._4_2_ + auVar12._4_2_) >> 4;
        auVar25._6_2_ = (ushort)(auVar7._6_2_ + auVar12._6_2_) >> 4;
        auVar25._8_2_ = (ushort)(auVar7._8_2_ + auVar12._8_2_) >> 4;
        auVar25._10_2_ = (ushort)(auVar7._10_2_ + auVar12._10_2_) >> 4;
        auVar25._12_2_ = (ushort)(auVar7._12_2_ + auVar12._12_2_) >> 4;
        auVar25._14_2_ = (ushort)(auVar7._14_2_ + auVar12._14_2_) >> 4;
        auVar14 = lddqu(auVar1._2_16_,*pauVar3);
        auVar7 = pshuflw(ZEXT416(uVar5),ZEXT416(uVar5),0);
        sVar6 = auVar7._0_2_;
        auVar8._0_2_ = -(ushort)(auVar10._0_2_ < sVar6);
        sVar9 = auVar7._2_2_;
        auVar8._2_2_ = -(ushort)(auVar10._2_2_ < sVar9);
        auVar8._4_2_ = -(ushort)(auVar10._4_2_ < sVar6);
        auVar8._6_2_ = -(ushort)(auVar10._6_2_ < sVar9);
        auVar8._8_2_ = -(ushort)(auVar10._8_2_ < sVar6);
        auVar8._10_2_ = -(ushort)(auVar10._10_2_ < sVar9);
        auVar8._12_2_ = -(ushort)(auVar10._12_2_ < sVar6);
        auVar8._14_2_ = -(ushort)(auVar10._14_2_ < sVar9);
        auVar7 = pblendvb(auVar14,auVar25,auVar8);
        *pauVar3 = auVar7;
        auVar14 = lddqu(auVar7,*pauVar2);
        pauVar3 = pauVar3 + 1;
        pauVar2 = pauVar2 + 1;
        auVar7 = auVar13;
        auVar13 = auVar14;
      }
    }
    else {
      auVar11 = lddqu(in_XMM2,(undefined1  [16])
                              av1_highbd_filter_intra_edge_sse4_1::kern[strength - 1U]);
      auVar7 = lddqu(auVar7,*pauVar2);
      auVar13 = lddqu(in_XMM5,pauVar2[1]);
      pauVar2 = pauVar2 + 2;
      auVar12 = pmovsxbw(in_XMM3,0x808080808080808);
      for (; 0 < (int)uVar4; uVar4 = uVar4 - uVar5) {
        uVar5 = 8;
        if (uVar4 < 8) {
          uVar5 = uVar4;
        }
        sVar6 = auVar7._4_2_;
        sVar9 = auVar7._6_2_;
        sVar18 = auVar7._8_2_;
        sVar19 = auVar7._10_2_;
        sVar20 = auVar7._12_2_;
        sVar21 = auVar7._14_2_;
        sVar22 = auVar13._0_2_;
        sVar23 = auVar13._2_2_;
        auVar15._0_2_ = sVar9 + sVar6 + auVar7._2_2_;
        auVar15._2_2_ = sVar18 + sVar9 + sVar6;
        auVar15._4_2_ = sVar19 + sVar18 + sVar9;
        auVar15._6_2_ = sVar20 + sVar19 + sVar18;
        auVar15._8_2_ = sVar21 + sVar20 + sVar19;
        auVar15._10_2_ = sVar22 + sVar21 + sVar20;
        auVar15._12_2_ = sVar23 + sVar22 + sVar21;
        auVar15._14_2_ = auVar13._4_2_ + sVar23 + sVar22;
        auVar26._0_2_ = (sVar18 + auVar7._0_2_) * auVar11._0_2_;
        auVar26._2_2_ = auVar15._0_2_ * auVar11._2_2_;
        auVar26._4_2_ = (sVar19 + auVar7._2_2_) * auVar11._4_2_;
        auVar26._6_2_ = auVar15._2_2_ * auVar11._6_2_;
        auVar26._8_2_ = (sVar20 + sVar6) * auVar11._8_2_;
        auVar26._10_2_ = auVar15._4_2_ * auVar11._10_2_;
        auVar26._12_2_ = (sVar21 + sVar9) * auVar11._12_2_;
        auVar26._14_2_ = auVar15._6_2_ * auVar11._14_2_;
        auVar17._0_2_ = (sVar22 + sVar18) * auVar11._0_2_;
        auVar17._2_2_ = auVar15._8_2_ * auVar11._2_2_;
        auVar17._4_2_ = (sVar23 + sVar19) * auVar11._4_2_;
        auVar17._6_2_ = auVar15._10_2_ * auVar11._6_2_;
        auVar17._8_2_ = (auVar13._4_2_ + sVar20) * auVar11._8_2_;
        auVar17._10_2_ = auVar15._12_2_ * auVar11._10_2_;
        auVar17._12_2_ = (auVar13._6_2_ + sVar21) * auVar11._12_2_;
        auVar17._14_2_ = auVar15._14_2_ * auVar11._14_2_;
        auVar7 = phaddw(auVar26,auVar17);
        auVar27._0_2_ = (ushort)(auVar7._0_2_ + auVar12._0_2_) >> 4;
        auVar27._2_2_ = (ushort)(auVar7._2_2_ + auVar12._2_2_) >> 4;
        auVar27._4_2_ = (ushort)(auVar7._4_2_ + auVar12._4_2_) >> 4;
        auVar27._6_2_ = (ushort)(auVar7._6_2_ + auVar12._6_2_) >> 4;
        auVar27._8_2_ = (ushort)(auVar7._8_2_ + auVar12._8_2_) >> 4;
        auVar27._10_2_ = (ushort)(auVar7._10_2_ + auVar12._10_2_) >> 4;
        auVar27._12_2_ = (ushort)(auVar7._12_2_ + auVar12._12_2_) >> 4;
        auVar27._14_2_ = (ushort)(auVar7._14_2_ + auVar12._14_2_) >> 4;
        auVar15 = lddqu(auVar15,*pauVar3);
        auVar7 = pshuflw(ZEXT416(uVar5),ZEXT416(uVar5),0);
        sVar6 = auVar7._0_2_;
        auVar14._0_2_ = -(ushort)(auVar10._0_2_ < sVar6);
        sVar9 = auVar7._2_2_;
        auVar14._2_2_ = -(ushort)(auVar10._2_2_ < sVar9);
        auVar14._4_2_ = -(ushort)(auVar10._4_2_ < sVar6);
        auVar14._6_2_ = -(ushort)(auVar10._6_2_ < sVar9);
        auVar14._8_2_ = -(ushort)(auVar10._8_2_ < sVar6);
        auVar14._10_2_ = -(ushort)(auVar10._10_2_ < sVar9);
        auVar14._12_2_ = -(ushort)(auVar10._12_2_ < sVar6);
        auVar14._14_2_ = -(ushort)(auVar10._14_2_ < sVar9);
        auVar7 = pblendvb(auVar15,auVar27,auVar14);
        *pauVar3 = auVar7;
        auVar14 = lddqu(auVar7,*pauVar2);
        pauVar3 = pauVar3 + 1;
        pauVar2 = pauVar2 + 1;
        auVar7 = auVar13;
        auVar13 = auVar14;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_filter_intra_edge_sse4_1(uint16_t *p, int sz, int strength) {
  if (!strength) return;

  DECLARE_ALIGNED(16, static const int16_t, kern[3][8]) = {
    { 4, 8, 4, 8, 4, 8, 4, 8 },  // strength 1: 4,8,4
    { 5, 6, 5, 6, 5, 6, 5, 6 },  // strength 2: 5,6,5
    { 2, 4, 2, 4, 2, 4, 2, 4 }   // strength 3: 2,4,4,4,2
  };

  DECLARE_ALIGNED(16, static const int16_t,
                  v_const[1][8]) = { { 0, 1, 2, 3, 4, 5, 6, 7 } };

  // Extend the first and last samples to simplify the loop for the 5-tap case
  p[-1] = p[0];
  __m128i last = _mm_set1_epi16(p[sz - 1]);
  _mm_storeu_si128((__m128i *)&p[sz], last);

  // Adjust input pointer for filter support area
  uint16_t *in = (strength == 3) ? p - 1 : p;

  // Avoid modifying first sample
  uint16_t *out = p + 1;
  int len = sz - 1;

  const int use_3tap_filter = (strength < 3);

  if (use_3tap_filter) {
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[0]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
    __m128i in8 = _mm_lddqu_si128((__m128i *)&in[8]);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i in1 = _mm_alignr_epi8(in8, in0, 2);
      __m128i in2 = _mm_alignr_epi8(in8, in0, 4);
      __m128i in02 = _mm_add_epi16(in0, in2);
      __m128i d0 = _mm_unpacklo_epi16(in02, in1);
      __m128i d1 = _mm_unpackhi_epi16(in02, in1);
      d0 = _mm_mullo_epi16(d0, coef0);
      d1 = _mm_mullo_epi16(d1, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srli_epi16(d0, 4);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi16(n_out);
      __m128i mask = _mm_cmpgt_epi16(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storeu_si128((__m128i *)out, out0);
      in += 8;
      in0 = in8;
      in8 = _mm_lddqu_si128((__m128i *)&in[8]);
      out += 8;
      len -= n_out;
    }
  } else {  // 5-tap filter
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[0]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
    __m128i in8 = _mm_lddqu_si128((__m128i *)&in[8]);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i in1 = _mm_alignr_epi8(in8, in0, 2);
      __m128i in2 = _mm_alignr_epi8(in8, in0, 4);
      __m128i in3 = _mm_alignr_epi8(in8, in0, 6);
      __m128i in4 = _mm_alignr_epi8(in8, in0, 8);
      __m128i in04 = _mm_add_epi16(in0, in4);
      __m128i in123 = _mm_add_epi16(in1, in2);
      in123 = _mm_add_epi16(in123, in3);
      __m128i d0 = _mm_unpacklo_epi16(in04, in123);
      __m128i d1 = _mm_unpackhi_epi16(in04, in123);
      d0 = _mm_mullo_epi16(d0, coef0);
      d1 = _mm_mullo_epi16(d1, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srli_epi16(d0, 4);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi16(n_out);
      __m128i mask = _mm_cmpgt_epi16(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storeu_si128((__m128i *)out, out0);
      in += 8;
      in0 = in8;
      in8 = _mm_lddqu_si128((__m128i *)&in[8]);
      out += 8;
      len -= n_out;
    }
  }
}